

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTport.c
# Opt level: O0

void sbfTportSecondDestroyStreamCb(int fd,short events,void *closure)

{
  long lVar1;
  long *in_RDX;
  sbfTport tport;
  sbfTportDestroyStreamClosure *closure0;
  
  lVar1 = *in_RDX;
  sbfLog_log(*(undefined8 *)(lVar1 + 8),0,"second destroy callback for stream %p",in_RDX[1]);
  pthread_mutex_lock((pthread_mutex_t *)(lVar1 + 0x180));
  *(int *)(lVar1 + 0x1d8) = *(int *)(lVar1 + 0x1d8) + -1;
  pthread_cond_broadcast((pthread_cond_t *)(lVar1 + 0x1a8));
  pthread_mutex_unlock((pthread_mutex_t *)(lVar1 + 0x180));
  free(in_RDX);
  return;
}

Assistant:

static void
sbfTportSecondDestroyStreamCb (int fd, short events, void* closure)
{
    sbfTportDestroyStreamClosure* closure0 = closure;
    sbfTport                      tport = closure0->mTport;

    sbfLog_debug (tport->mLog,
                  "second destroy callback for stream %p",
                  closure0->mTportStream);

    sbfMutex_lock (&tport->mStreamsLock);
    tport->mStreamsWaiting--;
    sbfCondVar_broadcast (&tport->mStreamsCondVar);
    sbfMutex_unlock (&tport->mStreamsLock);

    free (closure0);
}